

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

ssize_t trompeloeil::reporter<trompeloeil::specialized>::send
                  (int __fd,void *__buf,size_t __n,int __flags)

{
  StringRef names;
  StringRef message;
  ostream *poVar1;
  ssize_t sVar2;
  undefined4 in_register_0000000c;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef capturedExpression;
  SourceLineInfo local_248;
  Capturer capturer0;
  __string_type failure;
  AssertionHandler catchAssertionHandler;
  ostringstream os;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  if (__n != 0) {
    poVar1 = std::operator<<((ostream *)&os,(char *)__buf);
    poVar1 = std::operator<<(poVar1,':');
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,'\n');
  }
  std::operator<<((ostream *)&os,(char *)CONCAT44(in_register_0000000c,__flags));
  std::__cxx11::stringbuf::str();
  if (__fd == 0) {
    capturer0.m_messages.super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_ccc14;
    capturer0.m_messages.super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2c;
    macroName_01.m_size = 4;
    macroName_01.m_start = "FAIL";
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,macroName_01,(SourceLineInfo *)&capturer0,
               (StringRef)ZEXT816(0x32dce1),Normal);
    local_248.file = (char *)0x0;
    local_248.line = 0;
    Catch::ReusableStringStream::ReusableStringStream((ReusableStringStream *)&local_248);
    std::operator<<((ostream *)local_248.line,(string *)&failure);
    Catch::ReusableStringStream::str_abi_cxx11_
              ((string *)&capturer0,(ReusableStringStream *)&local_248);
    message.m_size =
         (size_type)
         capturer0.m_messages.
         super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
         super__Vector_impl_data._M_finish;
    message.m_start =
         (char *)capturer0.m_messages.
                 super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl
                 .super__Vector_impl_data._M_start;
    Catch::AssertionHandler::handleMessage(&catchAssertionHandler,ExplicitFailure,message);
    std::__cxx11::string::~string((string *)&capturer0);
    Catch::ReusableStringStream::~ReusableStringStream((ReusableStringStream *)&local_248);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  }
  else {
    catchAssertionHandler.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/build_O2/_deps/trompeloeil-src/include/catch2/trompeloeil.hpp"
    ;
    catchAssertionHandler.m_assertionInfo.macroName.m_size = 0x35;
    names.m_size = 7;
    names.m_start = "failure";
    macroName.m_size = 7;
    macroName.m_start = "CAPTURE";
    Catch::Capturer::Capturer
              (&capturer0,macroName,(SourceLineInfo *)&catchAssertionHandler,Info,names);
    Catch::Capturer::captureValues<std::__cxx11::string>(&capturer0,0,&failure);
    local_248.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/build_O2/_deps/trompeloeil-src/include/catch2/trompeloeil.hpp"
    ;
    local_248.line = 0x36;
    macroName_00.m_size = 5;
    macroName_00.m_start = "CHECK";
    capturedExpression.m_size = 0xf;
    capturedExpression.m_start = "failure.empty()";
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,macroName_00,&local_248,capturedExpression,ContinueOnFailure);
    local_248.file = (char *)CONCAT71(local_248.file._1_7_,failure._M_string_length == 0);
    Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_248);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    Catch::Capturer::~Capturer(&capturer0);
  }
  std::__cxx11::string::~string((string *)&failure);
  sVar2 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  return sVar2;
}

Assistant:

inline void reporter<specialized>::send(
    severity s,
    const char* file,
    unsigned long line,
    const char* msg)
  {
    std::ostringstream os;
    if (line) os << file << ':' << line << '\n';
    os << msg;
    auto failure = os.str();
    if (s == severity::fatal)
    {
#ifdef CATCH_CONFIG_PREFIX_ALL
      CATCH_FAIL(failure);
#else
      FAIL(failure);
#endif
    }
    else
    {
#ifdef CATCH_CONFIG_PREFIX_ALL
      CATCH_CAPTURE(failure);
      CATCH_CHECK(failure.empty());
#else
      CAPTURE(failure);
      CHECK(failure.empty());
#endif
    }
  }